

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_namespace::preprocess
          (method_namespace *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  const_reference pptVar1;
  token_base **pptVar2;
  var_id *this_00;
  string *psVar3;
  string name;
  var *in_stack_00000140;
  char (*in_stack_00000148) [35];
  domain_manager *in_stack_00000150;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffff98;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffffb0;
  string local_38 [24];
  iterator *in_stack_ffffffffffffffe0;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_ffffffffffffffb0);
  pptVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  token_expr::get_tree((token_expr *)*pptVar1);
  tree_type<cs::token_base_*>::root(in_stack_ffffffffffffff98);
  pptVar2 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffffe0);
  this_00 = token_id::get_id((token_id *)*pptVar2);
  psVar3 = var_id::operator_cast_to_string_(this_00);
  std::__cxx11::string::string(local_38,(string *)psVar3);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x24df34);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x24df40);
  cs_impl::any::any<std::__cxx11::string>
            ((any *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  domain_manager::add_var_no_return<char_const(&)[35]>
            (in_stack_00000150,in_stack_00000148,in_stack_00000140);
  cs_impl::any::~any((any *)0x24df7b);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void method_namespace::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::string name = static_cast<token_id *>(static_cast<token_expr *>(raw.front().at(
		                       1))->get_tree().root().data())->get_id();
		context->instance->storage.add_var_no_return("__PRAGMA_CS_NAMESPACE_DEFINITION__", name);
	}